

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_ssse3.c
# Opt level: O0

void aom_smooth_h_predictor_4x8_ssse3
               (uint8_t *dst,ptrdiff_t stride,uint8_t *top_row,uint8_t *left_column)

{
  byte bVar1;
  undefined4 uVar2;
  uint3 uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  ulong uVar19;
  ulong uVar20;
  undefined4 *in_RCX;
  long in_RDX;
  long in_RSI;
  undefined4 *in_RDI;
  undefined4 *puVar21;
  ushort uVar23;
  undefined1 auVar22 [16];
  int val_6;
  int val_1;
  int val;
  __m128i tmp_2;
  __m128i tmp_1;
  __m128i tmp;
  __m128i cvtepi32_epi8_7;
  __m128i pred_7;
  __m128i pred_sum_7;
  __m128i weighted_left_y_7;
  __m128i cvtepi32_epi8_6;
  __m128i pred_6;
  __m128i pred_sum_6;
  __m128i weighted_left_y_6;
  __m128i cvtepi32_epi8_5;
  __m128i pred_5;
  __m128i pred_sum_5;
  __m128i weighted_left_y_5;
  __m128i cvtepi32_epi8_4;
  __m128i pred_4;
  __m128i pred_sum_4;
  __m128i weighted_left_y_4;
  __m128i cvtepi32_epi8_3;
  __m128i pred_3;
  __m128i pred_sum_3;
  __m128i weighted_left_y_3;
  __m128i cvtepi32_epi8_2;
  __m128i pred_2;
  __m128i pred_sum_2;
  __m128i weighted_left_y_2;
  __m128i cvtepi32_epi8_1;
  __m128i pred_1;
  __m128i pred_sum_1;
  __m128i weighted_left_y_1;
  __m128i cvtepi32_epi8;
  __m128i pred;
  __m128i pred_sum;
  __m128i weighted_left_y;
  int val_2;
  int val_3;
  int val_4;
  int val_5;
  int val_7;
  int val_8;
  int val_9;
  int val_10;
  ushort local_eb8;
  ushort uStack_eb4;
  ushort uStack_eac;
  byte local_e38;
  byte bStack_e37;
  byte bStack_e36;
  byte bStack_e35;
  byte local_dd8;
  byte bStack_dd7;
  byte bStack_dd6;
  byte bStack_dd5;
  ushort local_ca8;
  ushort uStack_ca4;
  ushort uStack_c9c;
  ushort local_be8;
  ushort uStack_be4;
  ushort uStack_bdc;
  ushort local_b28;
  ushort uStack_b24;
  ushort uStack_b1c;
  short local_a68;
  short sStack_a64;
  short sStack_a60;
  short sStack_a5c;
  ushort local_9a8;
  ushort uStack_9a4;
  ushort uStack_99c;
  ushort local_8e8;
  ushort uStack_8e4;
  ushort uStack_8dc;
  ushort local_828;
  ushort uStack_824;
  ushort uStack_81c;
  short local_768;
  short sStack_764;
  short sStack_760;
  short sStack_75c;
  uint uStack_684;
  uint uStack_67c;
  uint uStack_674;
  uint uStack_66c;
  uint uStack_644;
  uint uStack_63c;
  uint uStack_634;
  uint uStack_62c;
  uint uStack_604;
  uint uStack_5fc;
  uint uStack_5f4;
  uint uStack_5ec;
  uint uStack_5c4;
  uint uStack_5bc;
  uint uStack_5b4;
  uint uStack_5ac;
  uint uStack_584;
  uint uStack_57c;
  uint uStack_574;
  uint uStack_56c;
  uint uStack_544;
  uint uStack_53c;
  uint uStack_534;
  uint uStack_52c;
  uint uStack_504;
  uint uStack_4fc;
  uint uStack_4f4;
  uint uStack_4ec;
  uint uStack_4c4;
  uint uStack_4bc;
  uint uStack_4b4;
  uint uStack_4ac;
  undefined4 local_258;
  undefined4 local_208;
  undefined4 local_1b8;
  undefined4 local_168;
  undefined4 local_118;
  undefined4 local_c8;
  __m128i left_y;
  __m128i left;
  __m128i round;
  __m128i scaled_top_right;
  __m128i inverted_weights;
  __m128i scale;
  __m128i weights;
  __m128i top_right;
  
  bVar1 = *(byte *)(in_RDX + 3);
  local_eb8 = (ushort)bVar1;
  uStack_eb4 = (ushort)bVar1;
  uStack_eac = (ushort)bVar1;
  uStack_eb4 = uStack_eb4 * 0x6b;
  uVar23 = local_eb8 * 0xab;
  uStack_eac = uStack_eac * 0xc0;
  uVar2 = *in_RCX;
  local_dd8 = (byte)uVar2;
  bStack_dd7 = (byte)((uint)uVar2 >> 8);
  bStack_dd6 = (byte)((uint)uVar2 >> 0x10);
  bStack_dd5 = (byte)((uint)uVar2 >> 0x18);
  uVar3 = CONCAT12(bStack_dd7,(ushort)local_dd8);
  uVar19 = (ulong)CONCAT34(uVar3,(uint)uVar3) & 0xffff0000ffff;
  uVar20 = (ulong)CONCAT34(uVar3,(uint)uVar3) & 0xffff0000ffff;
  local_768 = (short)uVar19;
  sStack_764 = (short)(uVar19 >> 0x20);
  sStack_760 = (short)uVar20;
  sStack_75c = (short)(uVar20 >> 0x20);
  uStack_674 = (uint)uStack_eb4;
  uStack_66c = (uint)uStack_eac;
  uStack_684 = (uint)(ushort)(sStack_764 * 0x95);
  uStack_67c = (uint)(ushort)(sStack_75c * 0x40);
  auVar18._4_4_ = uStack_674 + uStack_684 + 0x800080 >> 8;
  auVar18._0_4_ = (uint)local_eb8 + (uint)(ushort)(local_768 * 0xff) + 0x800080 >> 8;
  auVar18._12_4_ = uStack_66c + uStack_67c + 0x800080 >> 8;
  auVar18._8_4_ = (uint)uVar23 + (uint)(ushort)(sStack_760 * 0x55) + 0x800080 >> 8;
  auVar17._8_8_ = 0xc0804000c080400;
  auVar17._0_8_ = 0xc0804000c080400;
  auVar22 = pshufb(auVar18,auVar17);
  local_258 = auVar22._0_4_;
  *in_RDI = local_258;
  local_828 = (ushort)bStack_dd7;
  uStack_824 = (ushort)bStack_dd7;
  uStack_81c = (ushort)bStack_dd7;
  uStack_634 = (uint)uStack_eb4;
  uStack_62c = (uint)uStack_eac;
  uStack_644 = (uint)(ushort)(uStack_824 * 0x95);
  uStack_63c = (uint)(ushort)(uStack_81c * 0x40);
  auVar16._4_4_ = uStack_634 + uStack_644 + 0x800080 >> 8;
  auVar16._0_4_ = (uint)local_eb8 + (uint)(ushort)(local_828 * 0xff) + 0x800080 >> 8;
  auVar16._12_4_ = uStack_62c + uStack_63c + 0x800080 >> 8;
  auVar16._8_4_ = (uint)uVar23 + (uint)(ushort)(local_828 * 0x55) + 0x800080 >> 8;
  auVar15._8_8_ = 0xc0804000c080400;
  auVar15._0_8_ = 0xc0804000c080400;
  auVar22 = pshufb(auVar16,auVar15);
  local_208 = auVar22._0_4_;
  *(undefined4 *)((long)in_RDI + in_RSI) = local_208;
  puVar21 = (undefined4 *)((long)in_RDI + in_RSI + in_RSI);
  local_8e8 = (ushort)bStack_dd6;
  uStack_8e4 = (ushort)bStack_dd6;
  uStack_8dc = (ushort)bStack_dd6;
  uStack_5f4 = (uint)uStack_eb4;
  uStack_5ec = (uint)uStack_eac;
  uStack_604 = (uint)(ushort)(uStack_8e4 * 0x95);
  uStack_5fc = (uint)(ushort)(uStack_8dc * 0x40);
  auVar14._4_4_ = uStack_5f4 + uStack_604 + 0x800080 >> 8;
  auVar14._0_4_ = (uint)local_eb8 + (uint)(ushort)(local_8e8 * 0xff) + 0x800080 >> 8;
  auVar14._12_4_ = uStack_5ec + uStack_5fc + 0x800080 >> 8;
  auVar14._8_4_ = (uint)uVar23 + (uint)(ushort)(local_8e8 * 0x55) + 0x800080 >> 8;
  auVar13._8_8_ = 0xc0804000c080400;
  auVar13._0_8_ = 0xc0804000c080400;
  auVar22 = pshufb(auVar14,auVar13);
  local_1b8 = auVar22._0_4_;
  *puVar21 = local_1b8;
  puVar21 = (undefined4 *)((long)puVar21 + in_RSI);
  local_9a8 = (ushort)bStack_dd5;
  uStack_9a4 = (ushort)bStack_dd5;
  uStack_99c = (ushort)bStack_dd5;
  uStack_5b4 = (uint)uStack_eb4;
  uStack_5ac = (uint)uStack_eac;
  uStack_5c4 = (uint)(ushort)(uStack_9a4 * 0x95);
  uStack_5bc = (uint)(ushort)(uStack_99c * 0x40);
  auVar12._4_4_ = uStack_5b4 + uStack_5c4 + 0x800080 >> 8;
  auVar12._0_4_ = (uint)local_eb8 + (uint)(ushort)(local_9a8 * 0xff) + 0x800080 >> 8;
  auVar12._12_4_ = uStack_5ac + uStack_5bc + 0x800080 >> 8;
  auVar12._8_4_ = (uint)uVar23 + (uint)(ushort)(local_9a8 * 0x55) + 0x800080 >> 8;
  auVar11._8_8_ = 0xc0804000c080400;
  auVar11._0_8_ = 0xc0804000c080400;
  auVar22 = pshufb(auVar12,auVar11);
  local_168 = auVar22._0_4_;
  *puVar21 = local_168;
  puVar21 = (undefined4 *)((long)puVar21 + in_RSI);
  uVar2 = in_RCX[1];
  local_e38 = (byte)uVar2;
  bStack_e37 = (byte)((uint)uVar2 >> 8);
  bStack_e36 = (byte)((uint)uVar2 >> 0x10);
  bStack_e35 = (byte)((uint)uVar2 >> 0x18);
  uVar3 = CONCAT12(bStack_e37,(ushort)local_e38);
  uVar19 = (ulong)CONCAT34(uVar3,(uint)uVar3) & 0xffff0000ffff;
  uVar20 = (ulong)CONCAT34(uVar3,(uint)uVar3) & 0xffff0000ffff;
  local_a68 = (short)uVar19;
  sStack_a64 = (short)(uVar19 >> 0x20);
  sStack_a60 = (short)uVar20;
  sStack_a5c = (short)(uVar20 >> 0x20);
  uStack_574 = (uint)uStack_eb4;
  uStack_56c = (uint)uStack_eac;
  uStack_584 = (uint)(ushort)(sStack_a64 * 0x95);
  uStack_57c = (uint)(ushort)(sStack_a5c * 0x40);
  auVar10._4_4_ = uStack_574 + uStack_584 + 0x800080 >> 8;
  auVar10._0_4_ = (uint)local_eb8 + (uint)(ushort)(local_a68 * 0xff) + 0x800080 >> 8;
  auVar10._12_4_ = uStack_56c + uStack_57c + 0x800080 >> 8;
  auVar10._8_4_ = (uint)uVar23 + (uint)(ushort)(sStack_a60 * 0x55) + 0x800080 >> 8;
  auVar9._8_8_ = 0xc0804000c080400;
  auVar9._0_8_ = 0xc0804000c080400;
  auVar22 = pshufb(auVar10,auVar9);
  local_118 = auVar22._0_4_;
  *puVar21 = local_118;
  puVar21 = (undefined4 *)((long)puVar21 + in_RSI);
  local_b28 = (ushort)bStack_e37;
  uStack_b24 = (ushort)bStack_e37;
  uStack_b1c = (ushort)bStack_e37;
  uStack_534 = (uint)uStack_eb4;
  uStack_52c = (uint)uStack_eac;
  uStack_544 = (uint)(ushort)(uStack_b24 * 0x95);
  uStack_53c = (uint)(ushort)(uStack_b1c * 0x40);
  auVar8._4_4_ = uStack_534 + uStack_544 + 0x800080 >> 8;
  auVar8._0_4_ = (uint)local_eb8 + (uint)(ushort)(local_b28 * 0xff) + 0x800080 >> 8;
  auVar8._12_4_ = uStack_52c + uStack_53c + 0x800080 >> 8;
  auVar8._8_4_ = (uint)uVar23 + (uint)(ushort)(local_b28 * 0x55) + 0x800080 >> 8;
  auVar7._8_8_ = 0xc0804000c080400;
  auVar7._0_8_ = 0xc0804000c080400;
  auVar22 = pshufb(auVar8,auVar7);
  local_c8 = auVar22._0_4_;
  *puVar21 = local_c8;
  puVar21 = (undefined4 *)((long)puVar21 + in_RSI);
  local_be8 = (ushort)bStack_e36;
  uStack_be4 = (ushort)bStack_e36;
  uStack_bdc = (ushort)bStack_e36;
  uStack_4f4 = (uint)uStack_eb4;
  uStack_4ec = (uint)uStack_eac;
  uStack_504 = (uint)(ushort)(uStack_be4 * 0x95);
  uStack_4fc = (uint)(ushort)(uStack_bdc * 0x40);
  auVar6._4_4_ = uStack_4f4 + uStack_504 + 0x800080 >> 8;
  auVar6._0_4_ = (uint)local_eb8 + (uint)(ushort)(local_be8 * 0xff) + 0x800080 >> 8;
  auVar6._12_4_ = uStack_4ec + uStack_4fc + 0x800080 >> 8;
  auVar6._8_4_ = (uint)uVar23 + (uint)(ushort)(local_be8 * 0x55) + 0x800080 >> 8;
  auVar5._8_8_ = 0xc0804000c080400;
  auVar5._0_8_ = 0xc0804000c080400;
  auVar22 = pshufb(auVar6,auVar5);
  left_y[1]._0_4_ = auVar22._0_4_;
  *puVar21 = (undefined4)left_y[1];
  local_ca8 = (ushort)bStack_e35;
  uStack_ca4 = (ushort)bStack_e35;
  uStack_c9c = (ushort)bStack_e35;
  uStack_4b4 = (uint)uStack_eb4;
  uStack_4ac = (uint)uStack_eac;
  uStack_4c4 = (uint)(ushort)(uStack_ca4 * 0x95);
  uStack_4bc = (uint)(ushort)(uStack_c9c * 0x40);
  auVar4._4_4_ = uStack_4b4 + uStack_4c4 + 0x800080 >> 8;
  auVar4._0_4_ = (uint)local_eb8 + (uint)(ushort)(local_ca8 * 0xff) + 0x800080 >> 8;
  auVar4._12_4_ = uStack_4ac + uStack_4bc + 0x800080 >> 8;
  auVar4._8_4_ = (uint)uVar23 + (uint)(ushort)(local_ca8 * 0x55) + 0x800080 >> 8;
  auVar22._8_8_ = 0xc0804000c080400;
  auVar22._0_8_ = 0xc0804000c080400;
  auVar22 = pshufb(auVar4,auVar22);
  scale[1]._0_4_ = auVar22._0_4_;
  *(undefined4 *)((long)puVar21 + in_RSI) = (undefined4)scale[1];
  return;
}

Assistant:

void aom_smooth_h_predictor_4x8_ssse3(
    uint8_t *LIBAOM_RESTRICT dst, ptrdiff_t stride,
    const uint8_t *LIBAOM_RESTRICT top_row,
    const uint8_t *LIBAOM_RESTRICT left_column) {
  const __m128i top_right = _mm_set1_epi32(top_row[3]);
  const __m128i weights = cvtepu8_epi32(Load4(smooth_weights));
  const __m128i scale = _mm_set1_epi16(1 << SMOOTH_WEIGHT_LOG2_SCALE);
  const __m128i inverted_weights = _mm_sub_epi32(scale, weights);
  const __m128i scaled_top_right = _mm_mullo_epi16(inverted_weights, top_right);
  const __m128i round = _mm_set1_epi16(1 << (SMOOTH_WEIGHT_LOG2_SCALE - 1));
  __m128i left = cvtepu8_epi32(Load4(left_column));
  __m128i left_y = _mm_shuffle_epi32(left, 0);
  write_smooth_horizontal_sum4(dst, &left_y, &weights, &scaled_top_right,
                               &round);
  dst += stride;
  left_y = _mm_shuffle_epi32(left, 0x55);
  write_smooth_horizontal_sum4(dst, &left_y, &weights, &scaled_top_right,
                               &round);
  dst += stride;
  left_y = _mm_shuffle_epi32(left, 0xaa);
  write_smooth_horizontal_sum4(dst, &left_y, &weights, &scaled_top_right,
                               &round);
  dst += stride;
  left_y = _mm_shuffle_epi32(left, 0xff);
  write_smooth_horizontal_sum4(dst, &left_y, &weights, &scaled_top_right,
                               &round);
  dst += stride;

  left = cvtepu8_epi32(Load4(left_column + 4));
  left_y = _mm_shuffle_epi32(left, 0);
  write_smooth_horizontal_sum4(dst, &left_y, &weights, &scaled_top_right,
                               &round);
  dst += stride;
  left_y = _mm_shuffle_epi32(left, 0x55);
  write_smooth_horizontal_sum4(dst, &left_y, &weights, &scaled_top_right,
                               &round);
  dst += stride;
  left_y = _mm_shuffle_epi32(left, 0xaa);
  write_smooth_horizontal_sum4(dst, &left_y, &weights, &scaled_top_right,
                               &round);
  dst += stride;
  left_y = _mm_shuffle_epi32(left, 0xff);
  write_smooth_horizontal_sum4(dst, &left_y, &weights, &scaled_top_right,
                               &round);
}